

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i a;
  __m256i alVar12;
  __m256i c;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256i *palVar19;
  int iVar20;
  int iVar21;
  __m256i *ptr;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m256i *pv_2;
  __m256i *pv_1;
  __m256i vCompare;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  parasail_result_t *result;
  __m256i insert_mask;
  int16_t maxp;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  __m256i vBias;
  int16_t score;
  int16_t bias;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvE;
  __m256i *pvHMax;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined1 in_stack_fffffffffffff5a0 [16];
  undefined4 in_stack_fffffffffffff5b0;
  undefined2 in_stack_fffffffffffff5b4;
  ushort in_stack_fffffffffffff5b6;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c4;
  undefined8 in_stack_fffffffffffff5c8;
  __m256i *palVar27;
  longlong in_stack_fffffffffffff5d0;
  __m256i *local_a20;
  long lStack_a08;
  __m256i local_9e0;
  undefined1 local_9c0 [32];
  longlong local_9a0;
  longlong lStack_998;
  longlong lStack_990;
  longlong lStack_988;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_900 [32];
  ushort local_8a4;
  __m256i *local_820;
  __m256i *local_818;
  __m256i *local_810;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  ushort local_7d4;
  ushort local_7d0;
  parasail_result_t *local_7b8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_590;
  undefined8 uStack_588;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_16","profile");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_16",
            "profile->profile16.score");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_16","profile->matrix");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_avx2_256_16",
            "profile->s1Len");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_striped_profile_avx2_256_16","s2");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_striped_profile_avx2_256_16","s2Len");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_avx2_256_16","open");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_striped_profile_avx2_256_16","gap");
    local_7b8 = (parasail_result_t *)0x0;
  }
  else {
    local_7e8 = 0;
    local_7e4 = *(int *)(in_RDI + 8);
    lVar2 = *(long *)(in_RDI + 0x10);
    iVar20 = (local_7e4 + 0xf) / 0x10;
    lVar3 = *(long *)(in_RDI + 0x30);
    local_7d0 = (ushort)in_ECX;
    auVar4 = vpinsrw_avx(ZEXT216(local_7d0),in_ECX & 0xffff,1);
    auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
    auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
    auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
    auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
    auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
    auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
    auVar5 = vpinsrw_avx(ZEXT216(local_7d0),in_ECX & 0xffff,1);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
    uStack_6d0 = auVar5._0_8_;
    uStack_6c8 = auVar5._8_8_;
    local_7d4 = (ushort)in_R8D;
    auVar5 = vpinsrw_avx(ZEXT216(local_7d4),in_R8D & 0xffff,1);
    auVar5 = vpinsrw_avx(auVar5,in_R8D & 0xffff,2);
    auVar5 = vpinsrw_avx(auVar5,in_R8D & 0xffff,3);
    auVar5 = vpinsrw_avx(auVar5,in_R8D & 0xffff,4);
    auVar5 = vpinsrw_avx(auVar5,in_R8D & 0xffff,5);
    auVar5 = vpinsrw_avx(auVar5,in_R8D & 0xffff,6);
    auVar5 = vpinsrw_avx(auVar5,in_R8D & 0xffff,7);
    auVar22 = vpinsrw_avx(ZEXT216(local_7d4),in_R8D & 0xffff,1);
    auVar22 = vpinsrw_avx(auVar22,in_R8D & 0xffff,2);
    auVar22 = vpinsrw_avx(auVar22,in_R8D & 0xffff,3);
    auVar22 = vpinsrw_avx(auVar22,in_R8D & 0xffff,4);
    auVar22 = vpinsrw_avx(auVar22,in_R8D & 0xffff,5);
    auVar22 = vpinsrw_avx(auVar22,in_R8D & 0xffff,6);
    auVar22 = vpinsrw_avx(auVar22,in_R8D & 0xffff,7);
    uStack_690 = auVar22._0_8_;
    uStack_688 = auVar22._8_8_;
    uVar25 = 0;
    auVar22 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar22 = vpinsrw_avx(auVar22,0,2);
    auVar22 = vpinsrw_avx(auVar22,0,3);
    auVar22 = vpinsrw_avx(auVar22,0,4);
    auVar22 = vpinsrw_avx(auVar22,0,5);
    auVar22 = vpinsrw_avx(auVar22,0,6);
    auVar22 = vpinsrw_avx(auVar22,0,7);
    auVar6 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar6 = vpinsrw_avx(auVar6,0,2);
    auVar6 = vpinsrw_avx(auVar6,0,3);
    auVar6 = vpinsrw_avx(auVar6,0,4);
    auVar6 = vpinsrw_avx(auVar6,0,5);
    auVar6 = vpinsrw_avx(auVar6,0,6);
    auVar6 = vpinsrw_avx(auVar6,0,7);
    uStack_650 = auVar6._0_8_;
    uStack_648 = auVar6._8_8_;
    local_8a4 = 0x8000;
    uVar26 = 0x8000;
    auVar6 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar6 = vpinsrw_avx(auVar6,0x8000,2);
    auVar6 = vpinsrw_avx(auVar6,0x8000,3);
    auVar6 = vpinsrw_avx(auVar6,0x8000,4);
    auVar6 = vpinsrw_avx(auVar6,0x8000,5);
    auVar6 = vpinsrw_avx(auVar6,0x8000,6);
    auVar6 = vpinsrw_avx(auVar6,0x8000,7);
    auVar23 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar23 = vpinsrw_avx(auVar23,0x8000,2);
    auVar23 = vpinsrw_avx(auVar23,0x8000,3);
    auVar23 = vpinsrw_avx(auVar23,0x8000,4);
    auVar23 = vpinsrw_avx(auVar23,0x8000,5);
    auVar23 = vpinsrw_avx(auVar23,0x8000,6);
    auVar23 = vpinsrw_avx(auVar23,0x8000,7);
    uStack_610 = auVar23._0_8_;
    uStack_608 = auVar23._8_8_;
    local_900._16_8_ = uStack_610;
    local_900._0_16_ = auVar6;
    local_900._24_8_ = uStack_608;
    uVar1 = *(undefined4 *)(lVar2 + 0x1c);
    auVar7 = vpinsrw_avx(ZEXT216(1),0,1);
    auVar7 = vpinsrw_avx(auVar7,0,2);
    auVar7 = vpinsrw_avx(auVar7,0,3);
    auVar7 = vpinsrw_avx(auVar7,0,4);
    auVar7 = vpinsrw_avx(auVar7,0,5);
    auVar7 = vpinsrw_avx(auVar7,0,6);
    auVar7 = vpinsrw_avx(auVar7,0,7);
    auVar8 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar8 = vpinsrw_avx(auVar8,0,2);
    auVar8 = vpinsrw_avx(auVar8,0,3);
    auVar8 = vpinsrw_avx(auVar8,0,4);
    auVar8 = vpinsrw_avx(auVar8,0,5);
    auVar8 = vpinsrw_avx(auVar8,0,6);
    auVar8 = vpinsrw_avx(auVar8,0,7);
    uStack_590 = auVar8._0_8_;
    uStack_588 = auVar8._8_8_;
    auVar11._16_8_ = uStack_590;
    auVar11._0_16_ = auVar7;
    auVar11._24_8_ = uStack_588;
    auVar9._16_8_ = uStack_650;
    auVar9._0_16_ = auVar22;
    auVar9._24_8_ = uStack_648;
    auVar9 = vpcmpgtw_avx2(auVar11,auVar9);
    auVar24 = ZEXT1664(auVar22);
    local_7b8 = parasail_result_new();
    if (local_7b8 == (parasail_result_t *)0x0) {
      local_7b8 = (parasail_result_t *)0x0;
    }
    else {
      local_7b8->flag = local_7b8->flag | 0x10200804;
      local_810 = parasail_memalign___m256i(0x20,(long)iVar20);
      local_818 = parasail_memalign___m256i(0x20,(long)iVar20);
      local_820 = parasail_memalign___m256i(0x20,(long)iVar20);
      ptr = parasail_memalign___m256i(0x20,(long)iVar20);
      if (local_810 == (__m256i *)0x0) {
        local_7b8 = (parasail_result_t *)0x0;
      }
      else if (local_818 == (__m256i *)0x0) {
        local_7b8 = (parasail_result_t *)0x0;
      }
      else if (local_820 == (__m256i *)0x0) {
        local_7b8 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_7b8 = (parasail_result_t *)0x0;
      }
      else {
        alVar12[0]._2_2_ = local_7d4;
        alVar12[0]._0_2_ = local_7d0;
        alVar12[0]._4_2_ = uVar25;
        alVar12[0]._6_2_ = uVar26;
        alVar12[1]._0_4_ = in_stack_fffffffffffff5c0;
        alVar12[1]._4_4_ = in_stack_fffffffffffff5c4;
        alVar12[2] = in_stack_fffffffffffff5c8;
        alVar12[3] = in_stack_fffffffffffff5d0;
        parasail_memset___m256i
                  (local_a20,alVar12,
                   CONCAT26(in_stack_fffffffffffff5b6,
                            CONCAT24(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)));
        c[0]._2_2_ = local_7d4;
        c[0]._0_2_ = local_7d0;
        c[0]._4_2_ = uVar25;
        c[0]._6_2_ = uVar26;
        c[1]._0_4_ = in_stack_fffffffffffff5c0;
        c[1]._4_4_ = in_stack_fffffffffffff5c4;
        c[2] = in_stack_fffffffffffff5c8;
        c[3] = in_stack_fffffffffffff5d0;
        parasail_memset___m256i
                  (local_a20,c,
                   CONCAT26(in_stack_fffffffffffff5b6,
                            CONCAT24(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)));
        local_7dc = 0;
        auVar22 = auVar6;
        while( true ) {
          palVar19 = local_810;
          palVar27 = local_820;
          uStack_908 = auVar23._8_8_;
          uStack_910 = auVar23._0_8_;
          if (in_EDX <= local_7dc) break;
          local_9c0._16_8_ = uStack_610;
          local_9c0._0_16_ = auVar6;
          local_9c0._24_8_ = uStack_608;
          auVar11 = vperm2i128_avx2(auVar24._0_32_,(undefined1  [32])local_810[iVar20 + -1],0x28);
          auVar11 = vpalignr_avx2((undefined1  [32])local_810[iVar20 + -1],auVar11,0xe);
          auVar10._16_8_ = uStack_610;
          auVar10._0_16_ = auVar6;
          auVar10._24_8_ = uStack_608;
          local_9e0 = (__m256i)vpblendvb_avx2(auVar11,auVar10,auVar9);
          iVar21 = *(int *)(*(long *)(lVar2 + 0x10) + (ulong)*(byte *)(in_RSI + local_7dc) * 4);
          if (local_7e8 == local_7dc + -2) {
            local_820 = local_818;
            local_810 = palVar27;
          }
          else {
            local_810 = local_818;
          }
          local_818 = palVar19;
          for (local_7d8 = 0; local_7d8 < iVar20; local_7d8 = local_7d8 + 1) {
            auVar11 = vpaddsw_avx2((undefined1  [32])local_9e0,
                                   *(undefined1 (*) [32])
                                    (lVar3 + (long)(iVar21 * iVar20) * 0x20 + (long)local_7d8 * 0x20
                                    ));
            alVar12 = ptr[local_7d8];
            auVar11 = vpmaxsw_avx2(auVar11,(undefined1  [32])ptr[local_7d8]);
            auVar11 = vpmaxsw_avx2(auVar11,local_9c0);
            palVar27 = local_810 + local_7d8;
            local_9e0[0] = auVar11._0_8_;
            local_9e0[1] = auVar11._8_8_;
            local_9e0[2] = auVar11._16_8_;
            local_9e0[3] = auVar11._24_8_;
            (*palVar27)[0] = local_9e0[0];
            (*palVar27)[1] = local_9e0[1];
            (*palVar27)[2] = local_9e0[2];
            (*palVar27)[3] = local_9e0[3];
            local_900 = vpmaxsw_avx2(auVar11,local_900);
            auVar18._16_8_ = uStack_6d0;
            auVar18._0_16_ = auVar4;
            auVar18._24_8_ = uStack_6c8;
            auVar10 = vpsubsw_avx2(auVar11,auVar18);
            auVar17._16_8_ = uStack_690;
            auVar17._0_16_ = auVar5;
            auVar17._24_8_ = uStack_688;
            auVar11 = vpsubsw_avx2((undefined1  [32])alVar12,auVar17);
            auVar11 = vpmaxsw_avx2(auVar11,auVar10);
            palVar27 = ptr + local_7d8;
            local_9a0 = auVar11._0_8_;
            lStack_998 = auVar11._8_8_;
            lStack_990 = auVar11._16_8_;
            lStack_988 = auVar11._24_8_;
            (*palVar27)[0] = local_9a0;
            (*palVar27)[1] = lStack_998;
            (*palVar27)[2] = lStack_990;
            (*palVar27)[3] = lStack_988;
            auVar16._16_8_ = uStack_690;
            auVar16._0_16_ = auVar5;
            auVar16._24_8_ = uStack_688;
            auVar11 = vpsubsw_avx2(local_9c0,auVar16);
            local_9c0 = vpmaxsw_avx2(auVar11,auVar10);
            local_9e0 = palVar19[local_7d8];
          }
          for (local_7e0 = 0; local_7e0 < 0x10; local_7e0 = local_7e0 + 1) {
            auVar11 = vperm2i128_avx2(auVar10,local_9c0,0x28);
            auVar11 = vpalignr_avx2(local_9c0,auVar11,0xe);
            local_9c0 = vpblendvb_avx2(auVar11,auVar10,auVar9);
            for (local_7d8 = 0; local_7d8 < iVar20; local_7d8 = local_7d8 + 1) {
              auVar11 = vpmaxsw_avx2((undefined1  [32])local_810[local_7d8],local_9c0);
              palVar27 = local_810 + local_7d8;
              local_9e0[0] = auVar11._0_8_;
              local_9e0[1] = auVar11._8_8_;
              local_9e0[2] = auVar11._16_8_;
              local_9e0[3] = auVar11._24_8_;
              (*palVar27)[0] = local_9e0[0];
              (*palVar27)[1] = local_9e0[1];
              (*palVar27)[2] = local_9e0[2];
              (*palVar27)[3] = local_9e0[3];
              local_900 = vpmaxsw_avx2(auVar11,local_900);
              auVar15._16_8_ = uStack_6d0;
              auVar15._0_16_ = auVar4;
              auVar15._24_8_ = uStack_6c8;
              auVar10 = vpsubsw_avx2(auVar11,auVar15);
              auVar14._16_8_ = uStack_690;
              auVar14._0_16_ = auVar5;
              auVar14._24_8_ = uStack_688;
              local_9c0 = vpsubsw_avx2(local_9c0,auVar14);
              auVar11 = vpcmpgtw_avx2(local_9c0,auVar10);
              if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar11 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar11 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar11 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar11 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar11 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar11 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar11 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar11 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar11 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar11 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar11 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar11 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar11 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar11 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar11 >> 0x7f,0) == '\0') &&
                                (auVar11 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar11 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar11 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar11 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar11 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar11 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar11 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar11 >> 0xbf,0) == '\0') &&
                        (auVar11 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar11 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar11 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar11 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar11 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar11 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar11 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar11[0x1f]) goto LAB_00bcddc8;
            }
          }
LAB_00bcddc8:
          auVar13._16_8_ = uStack_910;
          auVar13._0_16_ = auVar22;
          auVar13._24_8_ = uStack_908;
          auVar24 = ZEXT3264(auVar13);
          auVar11 = vpcmpgtw_avx2(local_900,auVar13);
          lStack_a08 = auVar11._24_8_;
          if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar11 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                            (auVar11 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar11 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar11 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar11 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar11 >> 0xbf,0) != '\0') ||
                    (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_a08 < 0)
          {
            a[1] = in_stack_fffffffffffff5a0._0_8_;
            a[2] = in_stack_fffffffffffff5a0._8_8_;
            a[0] = 0xbcde3b;
            a[3]._0_4_ = in_stack_fffffffffffff5b0;
            a[3]._4_2_ = in_stack_fffffffffffff5b4;
            a[3]._6_2_ = in_stack_fffffffffffff5b6;
            in_stack_fffffffffffff5b6 = _mm256_hmax_epi16_rpl(a);
            local_8a4 = in_stack_fffffffffffff5b6;
            if ((short)((short)uVar1 + 1U ^ 0x7fff) < (short)in_stack_fffffffffffff5b6) {
              local_7b8->flag = local_7b8->flag | 0x40;
              break;
            }
            auVar22 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5b6),(uint)in_stack_fffffffffffff5b6
                                  ,1);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,2);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,3);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,4);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,5);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,6);
            auVar23 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,7);
            auVar24 = ZEXT1664(auVar23);
            auVar22 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5b6),(uint)in_stack_fffffffffffff5b6
                                  ,1);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,2);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,3);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,4);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,5);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,6);
            auVar22 = vpinsrw_avx(auVar22,(uint)in_stack_fffffffffffff5b6,7);
            auVar22 = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar22;
            auVar23 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
            local_7e8 = local_7dc;
          }
          local_7dc = local_7dc + 1;
        }
        palVar27 = local_820;
        if (local_8a4 == 0x7fff) {
          local_7b8->flag = local_7b8->flag | 0x40;
        }
        iVar21 = parasail_result_is_saturated(local_7b8);
        if (iVar21 == 0) {
          if (local_7e8 == local_7dc + -1) {
            local_820 = local_810;
            local_810 = palVar27;
          }
          else if (local_7e8 == local_7dc + -2) {
            local_820 = local_818;
            local_818 = palVar27;
          }
          local_7e4 = local_7e4 + -1;
          palVar27 = local_820;
          for (local_7d8 = 0; local_7d8 < iVar20 * 0x10; local_7d8 = local_7d8 + 1) {
            if (((ushort)(*palVar27)[0] == local_8a4) &&
               (iVar21 = local_7d8 / 0x10 + (local_7d8 % 0x10) * iVar20, iVar21 < local_7e4)) {
              local_7e4 = iVar21;
            }
            palVar27 = (__m256i *)((long)*palVar27 + 2);
          }
        }
        else {
          local_8a4 = 0x7fff;
          local_7e4 = 0;
          local_7e8 = 0;
        }
        local_7b8->score = (short)local_8a4 + 0x8000;
        local_7b8->end_query = local_7e4;
        local_7b8->end_ref = local_7e8;
        parasail_free(ptr);
        parasail_free(local_820);
        parasail_free(local_818);
        parasail_free(local_810);
      }
    }
  }
  return local_7b8;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}